

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

Sfm_Lib_t * Sfm_LibStart(int nVars,int fDelay,int fVerbose)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  Sfm_Lib_t *pSVar3;
  word *pEntry;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int *piVar6;
  Sfm_Fun_t *pSVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  pSVar3 = (Sfm_Lib_t *)calloc(1,0xa0);
  if (8 < nVars) {
    __assert_fail("nVars <= SFM_SUPP_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                  ,0xcf,"Sfm_Lib_t *Sfm_LibStart(int, int, int)");
  }
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  __size = (ulong)uVar1 * 8;
  pEntry = (word *)malloc(__size);
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = uVar1;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  uVar10 = 9999;
  while( true ) {
    do {
      uVar9 = uVar10;
      uVar10 = uVar9 + 1;
    } while ((uVar9 & 1) != 0);
    if (uVar10 < 9) break;
    iVar8 = 5;
    while (uVar10 % (iVar8 - 2U) != 0) {
      uVar2 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar10 < uVar2) goto LAB_004bea3d;
    }
  }
LAB_004bea3d:
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar2 = 0x10;
  if (0xe < uVar9) {
    uVar2 = uVar10;
  }
  pVVar4->nCap = uVar2;
  piVar5 = (int *)malloc((long)(int)uVar2 << 2);
  pVVar4->pArray = piVar5;
  pVVar4->nSize = uVar10;
  memset(piVar5,0xff,(long)(int)uVar10 << 2);
  p->vTable = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 10000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(40000);
  pVVar4->pArray = piVar5;
  p->vNexts = pVVar4;
  memset(pEntry,0,__size);
  iVar8 = Vec_MemHashInsert(p,pEntry);
  if (iVar8 != 0) {
    __assert_fail("Value == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x189,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  memset(pEntry,0xaa,__size);
  iVar8 = Vec_MemHashInsert(p,pEntry);
  if (iVar8 != 1) {
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x18e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  if (pEntry != (word *)0x0) {
    free(pEntry);
  }
  pSVar3->vTtMem = p;
  piVar5 = (int *)malloc(0x40000);
  (pSVar3->vLists).pArray = piVar5;
  if (piVar5 != (int *)0x0) {
    (pSVar3->vLists).nCap = 0x10000;
    piVar6 = (int *)malloc(0x40000);
    (pSVar3->vCounts).pArray = piVar6;
    if (piVar6 != (int *)0x0) {
      (pSVar3->vCounts).nCap = 0x10000;
      piVar6 = (int *)malloc(0x40000);
      (pSVar3->vHits).pArray = piVar6;
      if (piVar6 != (int *)0x0) {
        (pSVar3->vHits).nCap = 0x10000;
        piVar5[0] = -1;
        piVar5[1] = -1;
        (pSVar3->vLists).nSize = 2;
        piVar5 = (pSVar3->vCounts).pArray;
        if ((pSVar3->vCounts).nCap < 2) {
          if (piVar5 == (int *)0x0) {
            piVar5 = (int *)malloc(8);
          }
          else {
            piVar5 = (int *)realloc(piVar5,8);
          }
          (pSVar3->vCounts).pArray = piVar5;
          if (piVar5 == (int *)0x0) goto LAB_004bed21;
          (pSVar3->vCounts).nCap = 2;
        }
        piVar5[0] = -1;
        piVar5[1] = -1;
        (pSVar3->vCounts).nSize = 2;
        piVar5 = (pSVar3->vHits).pArray;
        if ((pSVar3->vHits).nCap < 2) {
          if (piVar5 == (int *)0x0) {
            piVar5 = (int *)malloc(8);
          }
          else {
            piVar5 = (int *)realloc(piVar5,8);
          }
          (pSVar3->vHits).pArray = piVar5;
          if (piVar5 == (int *)0x0) goto LAB_004bed21;
          (pSVar3->vHits).nCap = 2;
        }
        piVar5[0] = -1;
        piVar5[1] = -1;
        (pSVar3->vHits).nSize = 2;
        pSVar3->nObjsAlloc = 0x10000;
        pSVar7 = (Sfm_Fun_t *)calloc(0x10000,0x1c);
        pSVar3->pObjs = pSVar7;
        pSVar3->fDelay = fDelay;
        if (fDelay != 0) {
          if ((pSVar3->vProfs).nCap < 0x10000) {
            piVar5 = (pSVar3->vProfs).pArray;
            if (piVar5 == (int *)0x0) {
              piVar5 = (int *)malloc(0x40000);
            }
            else {
              piVar5 = (int *)realloc(piVar5,0x40000);
            }
            (pSVar3->vProfs).pArray = piVar5;
            if (piVar5 == (int *)0x0) goto LAB_004bed21;
            (pSVar3->vProfs).nCap = 0x10000;
          }
          if ((pSVar3->vStore).nCap < 0x40000) {
            piVar5 = (pSVar3->vStore).pArray;
            if (piVar5 == (int *)0x0) {
              piVar5 = (int *)malloc(0x100000);
            }
            else {
              piVar5 = (int *)realloc(piVar5,0x100000);
            }
            (pSVar3->vStore).pArray = piVar5;
            if (piVar5 == (int *)0x0) goto LAB_004bed21;
            (pSVar3->vStore).nCap = 0x40000;
          }
        }
        if ((pSVar3->vTemp).nCap < 0x10) {
          piVar5 = (pSVar3->vTemp).pArray;
          if (piVar5 == (int *)0x0) {
            piVar5 = (int *)malloc(0x40);
          }
          else {
            piVar5 = (int *)realloc(piVar5,0x40);
          }
          (pSVar3->vTemp).pArray = piVar5;
          if (piVar5 == (int *)0x0) goto LAB_004bed21;
          (pSVar3->vTemp).nCap = 0x10;
        }
        pSVar3->nVars = nVars;
        pSVar3->nWords = uVar1;
        pSVar3->fVerbose = fVerbose;
        return pSVar3;
      }
    }
  }
LAB_004bed21:
  __assert_fail("p->pArray",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
}

Assistant:

Sfm_Lib_t * Sfm_LibStart( int nVars, int fDelay, int fVerbose )
{
    Sfm_Lib_t * p = ABC_CALLOC( Sfm_Lib_t, 1 );
    assert( nVars <= SFM_SUPP_MAX );
    p->vTtMem = Vec_MemAllocForTT( nVars, 0 );   
    Vec_IntGrow( &p->vLists,  (1 << 16) );
    Vec_IntGrow( &p->vCounts, (1 << 16) );
    Vec_IntGrow( &p->vHits,   (1 << 16) );
    Vec_IntFill( &p->vLists,  2, -1 );
    Vec_IntFill( &p->vCounts, 2, -1 );
    Vec_IntFill( &p->vHits,   2, -1 );
    p->nObjsAlloc = (1 << 16);
    p->pObjs = ABC_CALLOC( Sfm_Fun_t, p->nObjsAlloc );
    p->fDelay = fDelay;
    if ( fDelay ) Vec_IntGrow( &p->vProfs,  (1 << 16) );
    if ( fDelay ) Vec_IntGrow( &p->vStore,  (1 << 18) );
    Vec_IntGrow( &p->vTemp, 16 );
    p->nVars = nVars;
    p->nWords = Abc_TtWordNum( nVars );
    p->fVerbose = fVerbose;
    return p;
}